

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  bool bVar1;
  char *dst_00;
  char *src_00;
  ZSTD_outBuffer *pZVar2;
  uint uVar3;
  U32 UVar4;
  int iVar5;
  ZSTD_nextInputType_e ZVar6;
  ZSTD_DStream *code;
  ulong __n;
  ZSTD_DDict *pZVar7;
  void *neededInBuffSize_00;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  bool bVar12;
  char *local_1c8;
  ulong local_1c0;
  ulong local_1a8;
  uint local_19c;
  size_t local_198;
  char *local_188;
  size_t local_158;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  size_t nextSrcSizeHint;
  size_t flushedSize;
  size_t toFlushSize;
  size_t err_code_5;
  size_t loadedSize;
  int isSkipFrame;
  size_t toLoad_1;
  size_t neededInSize_1;
  size_t err_code_4;
  size_t neededInSize;
  size_t bufferSize;
  int tooLarge;
  int tooSmall;
  size_t neededOutBuffSize;
  size_t neededInBuffSize;
  size_t err_code_3;
  size_t err_code_2;
  size_t decompressedSize;
  size_t cSize;
  size_t err_code_1;
  size_t remainingInput;
  size_t toLoad;
  size_t hSize;
  size_t err_code;
  char *pcStack_68;
  U32 someMoreWork;
  char *op;
  char *oend;
  char *ostart;
  char *dst;
  char *ip;
  char *iend;
  char *istart;
  char *src;
  ZSTD_inBuffer *input_local;
  ZSTD_outBuffer *output_local;
  ZSTD_DStream *zds_local;
  
  istart = (char *)input->src;
  local_130 = istart;
  if (input->pos != 0) {
    local_130 = istart + input->pos;
  }
  iend = local_130;
  local_138 = istart;
  if (input->size != 0) {
    local_138 = istart + input->size;
  }
  ip = local_138;
  dst = local_130;
  ostart = (char *)output->dst;
  local_140 = ostart;
  if (output->pos != 0) {
    local_140 = ostart + output->pos;
  }
  oend = local_140;
  local_148 = ostart;
  if (output->size != 0) {
    local_148 = ostart + output->size;
  }
  op = local_148;
  pcStack_68 = local_140;
  bVar1 = true;
  if (input->size < input->pos) {
    zds_local = (ZSTD_DStream *)0xffffffffffffffb8;
  }
  else if (output->size < output->pos) {
    zds_local = (ZSTD_DStream *)0xffffffffffffffba;
  }
  else {
    src = (char *)input;
    input_local = (ZSTD_inBuffer *)output;
    output_local = (ZSTD_outBuffer *)zds;
    code = (ZSTD_DStream *)ZSTD_checkOutBuffer(zds,output);
    uVar3 = ERR_isError((size_t)code);
    zds_local = code;
    if (uVar3 == 0) {
      do {
        if (!bVar1) {
          *(long *)(src + 0x10) = (long)dst - *(long *)src;
          input_local->pos = (long)pcStack_68 - (long)input_local->src;
          output_local[0x4ef].size = (size_t)input_local->src;
          output_local[0x4ef].pos = input_local->size;
          output_local[0x4f0].dst = (void *)input_local->pos;
          if ((dst == iend) && (pcStack_68 == oend)) {
            *(int *)((long)&output_local[0x4ee].pos + 4) =
                 *(int *)((long)&output_local[0x4ee].pos + 4) + 1;
            if (0xf < *(int *)((long)&output_local[0x4ee].pos + 4)) {
              if (pcStack_68 == op) {
                return 0xffffffffffffffb0;
              }
              if (dst == ip) {
                return 0xffffffffffffffae;
              }
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                            ,0x902,
                            "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                           );
            }
          }
          else {
            *(undefined4 *)((long)&output_local[0x4ee].pos + 4) = 0;
          }
          sVar10 = ZSTD_nextSrcSizeToDecompress((ZSTD_DCtx *)output_local);
          if (sVar10 != 0) {
            ZVar6 = ZSTD_nextInputType((ZSTD_DCtx *)output_local);
            uVar11 = (long)(int)(uint)(ZVar6 == ZSTDnit_block) * 3 + sVar10;
            if (output_local[0x4ec].size <= uVar11) {
              return uVar11 - output_local[0x4ec].size;
            }
            __assert_fail("zds->inPos <= nextSrcSizeHint",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                          ,0x91b,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          if (output_local[0x4ee].dst == (void *)output_local[0x4ed].pos) {
            if ((int)output_local[0x4ee].pos != 0) {
              if (*(ulong *)(src + 8) <= *(ulong *)(src + 0x10)) {
                *(undefined4 *)&output_local[0x4eb].size = 2;
                return 1;
              }
              *(long *)(src + 0x10) = *(long *)(src + 0x10) + 1;
            }
            return 0;
          }
          if ((int)output_local[0x4ee].pos == 0) {
            *(long *)(src + 0x10) = *(long *)(src + 0x10) + -1;
            *(undefined4 *)&output_local[0x4ee].pos = 1;
          }
          return 1;
        }
        switch((int)output_local[0x4eb].size) {
        case 0:
          *(undefined4 *)&output_local[0x4eb].size = 1;
          output_local[0x4ee].dst = (void *)0x0;
          output_local[0x4ed].pos = 0;
          output_local[0x4ec].size = 0;
          output_local[0x4ee].size = 0;
          *(undefined4 *)&output_local[0x4ee].pos = 0;
          output_local[0x4ef].size = (size_t)input_local->src;
          output_local[0x4ef].pos = input_local->size;
          output_local[0x4f0].dst = (void *)input_local->pos;
        case 1:
          local_158 = ZSTD_getFrameHeader_advanced
                                ((ZSTD_frameHeader *)(output_local + 0x4df),
                                 (void *)((long)&output_local[0xf9d].dst + 4),
                                 output_local[0x4ee].size,(ZSTD_format_e)output_local[0x4e6].size);
          if ((*(int *)&output_local[0x4eb].dst != 0) && (output_local[0x4ea].pos != 0)) {
            ZSTD_DCtx_selectFrameDDict((ZSTD_DCtx *)output_local);
          }
          uVar3 = ERR_isError(local_158);
          if (uVar3 != 0) {
            return local_158;
          }
          if (local_158 == 0) {
            if ((((output_local[0x4df].dst == (void *)0xffffffffffffffff) ||
                 (*(int *)((long)&output_local[0x4df].pos + 4) == 1)) ||
                (op + -(long)pcStack_68 < output_local[0x4df].dst)) ||
               (sVar10 = ZSTD_findFrameCompressedSize(iend,(long)ip - (long)iend),
               pZVar2 = output_local, src_00 = iend, dst_00 = pcStack_68,
               (ulong)((long)ip - (long)iend) < sVar10)) {
              pZVar2 = output_local;
              if (((*(int *)&output_local[0x4ef].dst == 1) &&
                  (*(int *)((long)&output_local[0x4df].pos + 4) != 1)) &&
                 ((output_local[0x4df].dst != (void *)0xffffffffffffffff &&
                  (op + -(long)pcStack_68 < output_local[0x4df].dst)))) {
                return 0xffffffffffffffba;
              }
              pZVar7 = ZSTD_getDDict((ZSTD_DCtx *)output_local);
              sVar10 = ZSTD_decompressBegin_usingDDict((ZSTD_DCtx *)pZVar2,pZVar7);
              uVar3 = ERR_isError(sVar10);
              if (uVar3 != 0) {
                return sVar10;
              }
              UVar4 = MEM_readLE32((void *)((long)&output_local[0xf9d].dst + 4));
              if ((UVar4 & 0xfffffff0) == 0x184d2a50) {
                UVar4 = MEM_readLE32(&output_local[0xf9d].size);
                output_local[0x4de].pos = (ulong)UVar4;
                *(undefined4 *)((long)&output_local[0x4e1].pos + 4) = 7;
              }
              else {
                sVar10 = ZSTD_decodeFrameHeader
                                   ((ZSTD_DCtx *)output_local,
                                    (void *)((long)&output_local[0xf9d].dst + 4),
                                    output_local[0x4ee].size);
                uVar3 = ERR_isError(sVar10);
                if (uVar3 != 0) {
                  return sVar10;
                }
                output_local[0x4de].pos = 3;
                *(undefined4 *)((long)&output_local[0x4e1].pos + 4) = 2;
              }
              if (output_local[0x4df].size < 0x401) {
                local_198 = 0x400;
              }
              else {
                local_198 = output_local[0x4df].size;
              }
              output_local[0x4df].size = local_198;
              if (output_local[0x4ec].pos < output_local[0x4df].size) {
                return 0xfffffffffffffff0;
              }
              if ((uint)output_local[0x4df].pos < 5) {
                local_19c = 4;
              }
              else {
                local_19c = (uint)output_local[0x4df].pos;
              }
              neededInBuffSize_00 = (void *)(ulong)local_19c;
              if (*(int *)&output_local[0x4ef].dst == 0) {
                local_1a8 = ZSTD_decodingBufferSize_min
                                      (output_local[0x4df].size,
                                       (unsigned_long_long)output_local[0x4df].dst);
              }
              else {
                local_1a8 = 0;
              }
              ZSTD_DCtx_updateOversizedDuration
                        ((ZSTD_DStream *)output_local,(size_t)neededInBuffSize_00,local_1a8);
              bVar12 = true;
              if (neededInBuffSize_00 <= output_local[0x4ec].dst) {
                bVar12 = output_local[0x4ed].size < local_1a8;
              }
              iVar5 = ZSTD_DCtx_isOversizedTooLong((ZSTD_DStream *)output_local);
              if ((bVar12) || (iVar5 != 0)) {
                if (output_local[0x4e9].dst == (void *)0x0) {
                  ZSTD_customFree((void *)output_local[0x4eb].pos,
                                  *(ZSTD_customMem *)&output_local[0x4e7].size);
                  output_local[0x4ec].dst = (void *)0x0;
                  output_local[0x4ed].size = 0;
                  pvVar8 = ZSTD_customMalloc((long)neededInBuffSize_00 + local_1a8,
                                             *(ZSTD_customMem *)&output_local[0x4e7].size);
                  output_local[0x4eb].pos = (size_t)pvVar8;
                  if (output_local[0x4eb].pos == 0) {
                    return 0xffffffffffffffc0;
                  }
                }
                else {
                  if (output_local[0x4e9].dst < (void *)0x176e0) {
                    __assert_fail("zds->staticSize >= sizeof(ZSTD_DCtx)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                                  ,0x898,
                                  "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                                 );
                  }
                  if ((long)output_local[0x4e9].dst - 0x176e0U <
                      (long)neededInBuffSize_00 + local_1a8) {
                    return 0xffffffffffffffc0;
                  }
                }
                output_local[0x4ec].dst = neededInBuffSize_00;
                output_local[0x4ed].dst =
                     (void *)(output_local[0x4eb].pos + (long)output_local[0x4ec].dst);
                output_local[0x4ed].size = local_1a8;
              }
              *(undefined4 *)&output_local[0x4eb].size = 2;
switchD_01018f76_caseD_2:
              sVar10 = ZSTD_nextSrcSizeToDecompressWithInputSize
                                 ((ZSTD_DCtx *)output_local,(long)ip - (long)dst);
              if (sVar10 == 0) {
                *(undefined4 *)&output_local[0x4eb].size = 0;
                bVar1 = false;
              }
              else if ((ulong)((long)ip - (long)dst) < sVar10) {
                if (dst == ip) {
                  bVar1 = false;
                }
                else {
                  *(undefined4 *)&output_local[0x4eb].size = 3;
switchD_01018f76_caseD_3:
                  sVar10 = ZSTD_nextSrcSizeToDecompress((ZSTD_DCtx *)output_local);
                  uVar11 = sVar10 - output_local[0x4ec].size;
                  iVar5 = ZSTD_isSkipFrame((ZSTD_DCtx *)output_local);
                  sVar9 = ZSTD_nextSrcSizeToDecompressWithInputSize
                                    ((ZSTD_DCtx *)output_local,(long)ip - (long)dst);
                  if (sVar10 != sVar9) {
                    __assert_fail("neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                                  ,0x8c4,
                                  "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                                 );
                  }
                  if (iVar5 == 0) {
                    if ((long)output_local[0x4ec].dst - output_local[0x4ec].size < uVar11) {
                      return 0xffffffffffffffec;
                    }
                    err_code_5 = ZSTD_limitCopy((void *)(output_local[0x4eb].pos +
                                                        output_local[0x4ec].size),uVar11,dst,
                                                (long)ip - (long)dst);
                  }
                  else {
                    local_1c0 = uVar11;
                    if ((ulong)((long)ip - (long)dst) <= uVar11) {
                      local_1c0 = (long)ip - (long)dst;
                    }
                    err_code_5 = local_1c0;
                  }
                  if (err_code_5 != 0) {
                    dst = dst + err_code_5;
                    output_local[0x4ec].size = err_code_5 + output_local[0x4ec].size;
                  }
                  if (err_code_5 < uVar11) {
                    bVar1 = false;
                  }
                  else {
                    output_local[0x4ec].size = 0;
                    sVar10 = ZSTD_decompressContinueStream
                                       ((ZSTD_DStream *)output_local,&stack0xffffffffffffff98,op,
                                        (void *)output_local[0x4eb].pos,sVar10);
                    uVar3 = ERR_isError(sVar10);
                    if (uVar3 != 0) {
                      return sVar10;
                    }
                  }
                }
              }
              else {
                sVar9 = ZSTD_decompressContinueStream
                                  ((ZSTD_DStream *)output_local,&stack0xffffffffffffff98,op,dst,
                                   sVar10);
                uVar3 = ERR_isError(sVar9);
                if (uVar3 != 0) {
                  return sVar9;
                }
                if (dst == (char *)0x0) {
                  __assert_fail("ip != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                                ,0x8b5,
                                "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                               );
                }
                dst = dst + sVar10;
              }
            }
            else {
              sVar9 = (long)op - (long)pcStack_68;
              pZVar7 = ZSTD_getDDict((ZSTD_DCtx *)output_local);
              sVar9 = ZSTD_decompress_usingDDict
                                ((ZSTD_DCtx *)pZVar2,dst_00,sVar9,src_00,sVar10,pZVar7);
              uVar3 = ERR_isError(sVar9);
              if (uVar3 != 0) {
                return sVar9;
              }
              if (iend == (char *)0x0) {
                __assert_fail("istart != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                              ,0x85f,
                              "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                             );
              }
              dst = iend + sVar10;
              if (pcStack_68 == (char *)0x0) {
                local_188 = pcStack_68;
              }
              else {
                local_188 = pcStack_68 + sVar9;
              }
              pcStack_68 = local_188;
              output_local[0x4de].pos = 0;
              *(undefined4 *)&output_local[0x4eb].size = 0;
              bVar1 = false;
            }
          }
          else {
            uVar11 = local_158 - output_local[0x4ee].size;
            __n = (long)ip - (long)dst;
            if (ip < dst) {
              __assert_fail("iend >= ip",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                            ,0x842,
                            "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                           );
            }
            if (__n < uVar11) {
              if (__n != 0) {
                memcpy((void *)((long)&output_local[0xf9d].dst + output_local[0x4ee].size + 4),dst,
                       __n);
                output_local[0x4ee].size = __n + output_local[0x4ee].size;
              }
              *(undefined8 *)(src + 0x10) = *(undefined8 *)(src + 8);
              sVar10 = ZSTD_getFrameHeader_advanced
                                 ((ZSTD_frameHeader *)(output_local + 0x4df),
                                  (void *)((long)&output_local[0xf9d].dst + 4),
                                  output_local[0x4ee].size,(ZSTD_format_e)output_local[0x4e6].size);
              uVar3 = ERR_isError(sVar10);
              if (uVar3 != 0) {
                return sVar10;
              }
              iVar5 = 2;
              if ((int)output_local[0x4e6].size == 0) {
                iVar5 = 6;
              }
              if (local_158 < (ulong)(long)iVar5) {
                iVar5 = 2;
                if ((int)output_local[0x4e6].size == 0) {
                  iVar5 = 6;
                }
                local_158 = (size_t)iVar5;
              }
              return local_158 + (3 - output_local[0x4ee].size);
            }
            if (dst == (char *)0x0) {
              __assert_fail("ip != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                            ,0x850,
                            "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                           );
            }
            memcpy((void *)((long)&output_local[0xf9d].dst + output_local[0x4ee].size + 4),dst,
                   uVar11);
            output_local[0x4ee].size = local_158;
            dst = dst + uVar11;
          }
          break;
        case 2:
          goto switchD_01018f76_caseD_2;
        case 3:
          goto switchD_01018f76_caseD_3;
        case 4:
          sVar10 = (long)output_local[0x4ee].dst - output_local[0x4ed].pos;
          sVar9 = ZSTD_limitCopy(pcStack_68,(long)op - (long)pcStack_68,
                                 (void *)((long)output_local[0x4ed].dst + output_local[0x4ed].pos),
                                 sVar10);
          if (pcStack_68 == (char *)0x0) {
            local_1c8 = pcStack_68;
          }
          else {
            local_1c8 = pcStack_68 + sVar9;
          }
          pcStack_68 = local_1c8;
          output_local[0x4ed].pos = sVar9 + output_local[0x4ed].pos;
          if (sVar9 == sVar10) {
            *(undefined4 *)&output_local[0x4eb].size = 2;
            if (((void *)output_local[0x4ed].size < output_local[0x4df].dst) &&
               (output_local[0x4ed].size <
                output_local[0x4ed].pos + (ulong)(uint)output_local[0x4df].pos)) {
              output_local[0x4ee].dst = (void *)0x0;
              output_local[0x4ed].pos = 0;
            }
          }
          else {
            bVar1 = false;
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                        ,0x8f2,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
      } while( true );
    }
  }
  return (size_t)zds_local;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));
    FORWARD_IF_ERROR(ZSTD_checkOutBuffer(zds, output), "");

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            zds->legacyVersion = 0;
#endif
            zds->hostageByte = 0;
            zds->expectedOutBuffer = *output;
            ZSTD_FALLTHROUGH;

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                if (zds->refMultipleDDicts && zds->ddictSet) {
                    ZSTD_DCtx_selectFrameDDict(zds);
                }
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize), "");
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        /* check first few bytes */
                        FORWARD_IF_ERROR(
                            ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format),
                            "First few bytes detected incorrect" );
                        /* return hint input size */
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && zds->fParams.frameType != ZSTD_skippableFrame
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, (size_t)(iend-istart));
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, (size_t)(oend-op), istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    assert(istart != NULL);
                    ip = istart + cSize;
                    op = op ? op + decompressedSize : op; /* can occur if frameContentSize = 0 (empty frame) */
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Check output buffer is large enough for ZSTD_odm_stable. */
            if (zds->outBufferMode == ZSTD_bm_stable
                && zds->fParams.frameType != ZSTD_skippableFrame
                && zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && (U64)(size_t)(oend-op) < zds->fParams.frameContentSize) {
                RETURN_ERROR(dstSize_tooSmall, "ZSTD_obm_stable passed but ZSTD_outBuffer is too small");
            }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)), "");

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize), "");
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge, "");

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = zds->outBufferMode == ZSTD_bm_buffered
                        ? ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize)
                        : 0;

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation, "");
                        } else {
                            ZSTD_customFree(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_customMalloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation, "");
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            ZSTD_FALLTHROUGH;

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip));
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, ip, neededInSize), "");
                    assert(ip != NULL);
                    ip += neededInSize;
                    /* Function modifies the stage so we must break */
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            ZSTD_FALLTHROUGH;

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip)));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, (size_t)(iend-ip));
                }
                if (loadedSize != 0) {
                    /* ip may be NULL */
                    ip += loadedSize;
                    zds->inPos += loadedSize;
                }
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                zds->inPos = 0;   /* input is consumed */
                FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, zds->inBuff, neededInSize), "");
                /* Function modifies the stage so we must break */
                break;
            }
        case zdss_flush:
            {
                size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, (size_t)(oend-op), zds->outBuff + zds->outStart, toFlushSize);

                op = op ? op + flushedSize : op;

                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                        && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC, "impossible to reach");   /* some compilers require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));

    /* Update the expected output buffer for ZSTD_obm_stable. */
    zds->expectedOutBuffer = *output;

    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, noForwardProgress_destFull, "");
            RETURN_ERROR_IF(ip==iend, noForwardProgress_inputEmpty, "");
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}